

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O3

bool __thiscall S2EdgeCrosser::EdgeOrVertexCrossing(S2EdgeCrosser *this,S2Point *d)

{
  S2Point *c;
  bool bVar1;
  int iVar2;
  S2LogMessage SStack_28;
  
  c = this->c_;
  bVar1 = S2::IsUnitLength(d);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0x108,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: S2::IsUnitLength(*d) ",0x23);
    abort();
  }
  iVar2 = s2pred::TriageSign(this->a_,this->b_,d,&this->a_cross_b_);
  if ((iVar2 == 0) || (this->acb_ != -iVar2)) {
    this->bda_ = iVar2;
    iVar2 = CrossingSignInternal(this,d);
    if (-1 < iVar2) {
      if (iVar2 != 0) {
        return true;
      }
      bVar1 = S2::VertexCrossing(this->a_,this->b_,c,d);
      return bVar1;
    }
  }
  else {
    this->c_ = d;
  }
  return false;
}

Assistant:

inline bool S2EdgeCrosser::EdgeOrVertexCrossing(const S2Point* d) {
  // We need to copy c_ since it is clobbered by CrossingSign().
  const S2Point* c = c_;
  int crossing = CrossingSign(d);
  if (crossing < 0) return false;
  if (crossing > 0) return true;
  return S2::VertexCrossing(*a_, *b_, *c, *d);
}